

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_function.cpp
# Opt level: O0

PragmaFunction *
duckdb::PragmaFunction::PragmaCall
          (string *name,pragma_query_t query,vector<duckdb::LogicalType,_true> *arguments,
          LogicalType *varargs)

{
  string *in_RSI;
  PragmaFunction *in_RDI;
  LogicalType *in_stack_ffffffffffffff28;
  LogicalType *in_stack_ffffffffffffff30;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff88;
  pragma_function_t in_stack_ffffffffffffff90;
  pragma_query_t in_stack_ffffffffffffff98;
  PragmaType in_stack_ffffffffffffffa7;
  string *in_stack_ffffffffffffffa8;
  PragmaFunction *in_stack_ffffffffffffffb0;
  string local_48 [8];
  LogicalType *in_stack_ffffffffffffffc0;
  
  ::std::__cxx11::string::string(local_48,in_RSI);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff30,
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff28);
  LogicalType::LogicalType(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  PragmaFunction(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa7,
                 in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffffc0);
  LogicalType::~LogicalType((LogicalType *)0x2a5883f);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x2a58849);
  ::std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

PragmaFunction PragmaFunction::PragmaCall(const string &name, pragma_query_t query, vector<LogicalType> arguments,
                                          LogicalType varargs) {
	return PragmaFunction(name, PragmaType::PRAGMA_CALL, query, nullptr, std::move(arguments), std::move(varargs));
}